

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDFacePtr::CompareFacePointer(ON_SubDFacePtr *lhs,ON_SubDFacePtr *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ON__UINT_PTR rhs_ptr;
  ON__UINT_PTR lhs_ptr;
  ON_SubDFacePtr *rhs_local;
  ON_SubDFacePtr *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_SubDFacePtr *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_SubDFacePtr *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    uVar1 = lhs->m_ptr & 0xfffffffffffffff8;
    uVar2 = rhs->m_ptr & 0xfffffffffffffff8;
    if (uVar1 < uVar2) {
      lhs_local._4_4_ = -1;
    }
    else if (uVar2 < uVar1) {
      lhs_local._4_4_ = 1;
    }
    else {
      lhs_local._4_4_ = 0;
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDFacePtr::CompareFacePointer(
  const ON_SubDFacePtr* lhs,
  const ON_SubDFacePtr* rhs
)
{
  if (lhs == rhs)
    return 0;
  if ( nullptr == lhs )
    return 1;
  if ( nullptr == rhs )
    return -1;

  const ON__UINT_PTR lhs_ptr = (lhs->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  const ON__UINT_PTR rhs_ptr = (rhs->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;
  return 0;
}